

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O0

Vec_Int_t *
Gia_ManMaxiTest(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int nTimeOut,int fSim,
               int fVerbose)

{
  int nSize;
  Vec_Int_t *pVVar1;
  undefined8 local_40;
  Vec_Int_t *vInit;
  Vec_Int_t *vRes;
  int fSim_local;
  int nTimeOut_local;
  int nWords_local;
  int nFrames_local;
  Vec_Int_t *vInit0_local;
  Gia_Man_t *p_local;
  
  local_40 = vInit0;
  if (vInit0 == (Vec_Int_t *)0x0) {
    nSize = Gia_ManRegNum(p);
    local_40 = Vec_IntStart(nSize);
  }
  pVVar1 = Gia_ManMaxiPerform(p,local_40,nFrames,nTimeOut,fVerbose);
  if (local_40 != vInit0) {
    Vec_IntFree(local_40);
  }
  return pVVar1;
}

Assistant:

Vec_Int_t * Gia_ManMaxiTest( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vRes, * vInit;
    vInit = vInit0 ? vInit0 : Vec_IntStart( Gia_ManRegNum(p) );
    vRes = Gia_ManMaxiPerform( p, vInit, nFrames, nTimeOut, fVerbose );
    if ( vInit != vInit0 )
        Vec_IntFree( vInit );
    return vRes;
}